

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testinplacetext.cpp
# Opt level: O0

void Am_Inplace_Editor_Do_proc(Am_Object *inter)

{
  Am_Value *pAVar1;
  void *value;
  Am_Text_Info *pAVar2;
  Am_Text_Info *text_info;
  Am_Object feedback;
  Am_Object local_28;
  undefined1 local_20 [8];
  Am_Object_Method method;
  Am_Object *inter_local;
  
  method.Call = (Am_Object_Method_Type *)inter;
  pAVar1 = (Am_Value *)Am_Object::Get(0x1088,0xca);
  Am_Object_Method::Am_Object_Method((Am_Object_Method *)local_20,pAVar1);
  Am_Object::Am_Object(&local_28,(Am_Object *)inter);
  (*(code *)method.from_wrapper)(&local_28);
  Am_Object::~Am_Object(&local_28);
  Am_Object::Get_Owner((Am_Object *)&text_info,(Am_Slot_Flags)inter);
  Am_Object::Set((ushort)(Am_Object *)&text_info,true,0);
  pAVar1 = (Am_Value *)Am_Object::Get((ushort)&text_info,(ulong)Am_INPLACE_TEXT_INFO);
  value = Am_Value::operator_cast_to_void_(pAVar1);
  pAVar2 = Am_Text_Info::Narrow(value);
  (**pAVar2->_vptr_Am_Text_Info)();
  Am_Object::~Am_Object((Am_Object *)&text_info);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, Am_Inplace_Editor_Do,
                 (Am_Object inter))
{
  Am_Object_Method method = Am_Text_Edit_Interactor.Get(Am_DO_METHOD);
  method.Call(inter); // Call prototype method.

  Am_Object feedback = inter.Get_Owner();
  feedback.Set(Am_VISIBLE, false);
  Am_Text_Info *text_info =
      Am_Text_Info::Narrow((Am_Ptr)feedback.Get(Am_INPLACE_TEXT_INFO));
  text_info->Release();
}